

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7d7e51::cmLBDepend::AddDependency
          (cmLBDepend *this,cmDependInformation *info,string *file)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  cmDependInformation *info_00;
  _Rb_tree_node_base *p_Var3;
  _Alloc_node __an;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  
  info_00 = GetDependInformation(this,file,&info->PathOnly);
  GenerateDependInformation(this,info_00);
  if (info_00 == info) {
    return;
  }
  p_Var1 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) {
    bVar4 = true;
    p_Var5 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var5 = p_Var6;
      bVar4 = info_00 < *(cmDependInformation **)(p_Var5 + 1);
      p_Var6 = (&p_Var5->_M_left)[*(cmDependInformation **)(p_Var5 + 1) <= info_00];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  p_Var3 = p_Var5;
  if (bVar4) {
    if (p_Var5 == (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_00230b21;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
  }
  if (info_00 <= *(cmDependInformation **)(p_Var3 + 1)) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
    p_Var6 = p_Var3;
  }
LAB_00230b21:
  if (p_Var5 != (_Rb_tree_node_base *)0x0) {
    bVar4 = true;
    if ((p_Var6 == (_Base_ptr)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var5)) {
      bVar4 = info_00 < *(cmDependInformation **)(p_Var5 + 1);
    }
    p_Var3 = (_Rb_tree_node_base *)operator_new(0x28);
    *(cmDependInformation **)(p_Var3 + 1) = info_00;
    std::_Rb_tree_insert_and_rebalance(bVar4,p_Var3,p_Var5,&p_Var1->_M_header);
    psVar2 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  return;
}

Assistant:

void AddDependency(cmDependInformation* info, const std::string& file)
  {
    cmDependInformation* dependInfo =
      this->GetDependInformation(file, info->PathOnly);
    this->GenerateDependInformation(dependInfo);
    info->AddDependencies(dependInfo);
  }